

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void __thiscall IDisk::IDisk(IDisk *this)

{
  uint uVar1;
  Side *local_28;
  int index_bit;
  IDisk *this_local;
  
  this->_vptr_IDisk = (_func_int **)&PTR__IDisk_002c2c48;
  this->nb_sides_ = '\x01';
  local_28 = this->side_;
  do {
    local_28->tracks = (MFMTrack *)0x0;
    local_28->nb_tracks = 0;
    local_28 = local_28 + 1;
  } while (local_28 != (Side *)&this->head_position_);
  std::__cxx11::string::string((string *)&this->current_disk_path_);
  this->load_progress_ = 0xffffffff;
  this->log_ = (ILog *)0x0;
  this->fixed_speed_ = false;
  this->head_position_ = 0;
  this->disk_modified_ = false;
  std::__cxx11::string::operator=((string *)&this->current_disk_path_,"");
  this->side_[0].nb_tracks = 0;
  this->side_[0].tracks = (MFMTrack *)0x0;
  this->side_[1].nb_tracks = 0;
  this->side_[1].tracks = (MFMTrack *)0x0;
  uVar1 = AddByteToTrack(mfm_start_of_track_pattern,0,'\0',8,'\0');
  uVar1 = AddByteToTrack(mfm_start_of_track_pattern,uVar1,'\0',8,'\0');
  uVar1 = AddSyncByteToTrack(mfm_start_of_track_pattern,uVar1,0xc2);
  uVar1 = AddSyncByteToTrack(mfm_start_of_track_pattern,uVar1,0xc2);
  uVar1 = AddSyncByteToTrack(mfm_start_of_track_pattern,uVar1,0xc2);
  AddByteToTrack(mfm_start_of_track_pattern,uVar1,0xfc,8,'\0');
  uVar1 = AddByteToTrack(mfm_start_of_track_pattern2,0,'\0',8,'\0');
  uVar1 = AddByteToTrack(mfm_start_of_track_pattern2,uVar1,'\0',8,'\0');
  uVar1 = AddSyncByteToTrack(mfm_start_of_track_pattern2,uVar1,0xa1);
  uVar1 = AddSyncByteToTrack(mfm_start_of_track_pattern2,uVar1,0xa1);
  uVar1 = AddSyncByteToTrack(mfm_start_of_track_pattern2,uVar1,0xa1);
  AddByteToTrack(mfm_start_of_track_pattern2,uVar1,0xfe,8,'\0');
  AddByteToTrack(mfm_gap_4_e,0,'N',8,'\0');
  return;
}

Assistant:

IDisk::IDisk(): nb_sides_(1)
{
   load_progress_ = -1; // No progress by default
   log_ = nullptr;
   fixed_speed_ = false;

   head_position_ = 0;
   disk_modified_ = false;

   current_disk_path_ = "";

   side_[0].nb_tracks = 0;
   side_[0].tracks = nullptr;
   side_[1].nb_tracks = 0;
   side_[1].tracks = nullptr;

   int index_bit = 0;
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0x00);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0x00);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0xFC);

   index_bit = 0;
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0x00);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0x00);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xFE);

   AddByteToTrack(mfm_gap_4_e, 0, 0x4E);
}